

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *type,Reader *replacement,
          UpgradeToStructMode upgradeToStructMode)

{
  short sVar1;
  uint uVar2;
  short *psVar3;
  bool bVar4;
  uint uVar5;
  Exception *pEVar6;
  Maybe<capnp::schema::Node::Reader> *matchSize;
  uint uVar7;
  uint64_t structTypeId;
  Maybe<capnp::schema::Field::Reader> *matchPosition;
  StructDataBitCount *pSVar8;
  Fault *this_00;
  Fault f;
  Fault f_1;
  Reader local_168;
  Reader local_138;
  Maybe<capnp::schema::Field::Reader> local_108;
  Maybe<capnp::schema::Node::Reader> local_d0;
  Maybe<capnp::schema::Field::Reader> local_98;
  Maybe<capnp::schema::Node::Reader> local_60;
  
  this_00 = &f;
  uVar2 = (replacement->_reader).dataSize;
  if (uVar2 < 0x10) {
    if ((type->_reader).dataSize < 0x10) {
      return;
    }
    if (*(type->_reader).data == 0) {
      return;
    }
LAB_0016d229:
    if ((*(type->_reader).data == 0xd) && (bVar4 = canUpgradeToData(this,replacement), bVar4))
    goto LAB_0016d242;
LAB_0016d259:
    pSVar8 = &(type->_reader).dataSize;
    uVar2 = (replacement->_reader).dataSize;
    if (uVar2 < 0x10) {
      uVar5 = *pSVar8;
LAB_0016d296:
      bVar4 = true;
      if (0xf < uVar5) {
LAB_0016d29d:
        bVar4 = false;
        if ((0xf < uVar2) && (*(type->_reader).data == 0x12)) {
          uVar7 = (uint)*(replacement->_reader).data;
          if ((0xf < uVar7) || ((0x8fffU >> (uVar7 & 0x1f) & 1) == 0)) {
LAB_0016d242:
            replacementIsOlder(this);
            return;
          }
          bVar4 = false;
        }
      }
      if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
        if ((!bVar4) && (psVar3 = (short *)(type->_reader).data, *psVar3 == 0x10)) {
          if (uVar5 < 0x80) {
            structTypeId = 0;
          }
          else {
            structTypeId = *(uint64_t *)(psVar3 + 4);
          }
          matchSize = &local_60;
          local_60.ptr.isSet = false;
          matchPosition = &local_98;
          local_98.ptr.isSet = false;
LAB_0016d556:
          checkUpgradeToStruct(this,replacement,structTypeId,matchSize,matchPosition);
          return;
        }
        if ((0xf < uVar2) && (psVar3 = (short *)(replacement->_reader).data, *psVar3 == 0x10)) {
          if (uVar2 < 0x80) {
            structTypeId = 0;
          }
          else {
            structTypeId = *(uint64_t *)(psVar3 + 4);
          }
          matchSize = &local_d0;
          local_d0.ptr.isSet = false;
          matchPosition = &local_108;
          local_108.ptr.isSet = false;
          replacement = type;
          goto LAB_0016d556;
        }
      }
    }
    else {
      uVar5 = *pSVar8;
      if (*(replacement->_reader).data != 0x12) goto LAB_0016d296;
      if (0xf < uVar5) {
        uVar7 = (uint)*(type->_reader).data;
        if ((0xf < uVar7) || ((0x8fffU >> (uVar7 & 0x1f) & 1) == 0)) {
LAB_0016d209:
          replacementIsNewer(this);
          return;
        }
        goto LAB_0016d29d;
      }
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x3cc,FAILED,(char *)0x0,"\"a type was changed\"",
               (char (*) [19])"a type was changed");
  }
  else {
    sVar1 = *(replacement->_reader).data;
    uVar5 = (type->_reader).dataSize;
    if (uVar5 < 0x10) {
      if (sVar1 == 0) {
        return;
      }
LAB_0016d1ec:
      if (*(replacement->_reader).data == 0xd) {
        bVar4 = canUpgradeToData(this,type);
        if (bVar4) goto LAB_0016d209;
        uVar5 = (type->_reader).dataSize;
      }
      if (0xf < uVar5) goto LAB_0016d229;
      goto LAB_0016d259;
    }
    psVar3 = (short *)(type->_reader).data;
    if (sVar1 != *psVar3) goto LAB_0016d1ec;
    switch(sVar1) {
    case 0xe:
      f_1.exception = (Exception *)(type->_reader).segment;
      capnp::schema::Type::List::Reader::getElementType((Reader *)&f,(Reader *)&f_1);
      local_168._reader.segment = (replacement->_reader).segment;
      local_168._reader.capTable = (replacement->_reader).capTable;
      local_168._reader.data = (replacement->_reader).data;
      local_168._reader.pointers = (replacement->_reader).pointers;
      local_168._reader.dataSize = (replacement->_reader).dataSize;
      local_168._reader.pointerCount = (replacement->_reader).pointerCount;
      local_168._reader._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
      local_168._reader.nestingLimit = (replacement->_reader).nestingLimit;
      local_168._reader._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
      capnp::schema::Type::List::Reader::getElementType(&local_138,&local_168);
      checkCompatibility(this,(Reader *)&f,&local_138,ALLOW_UPGRADE_TO_STRUCT);
      return;
    case 0xf:
      if (uVar2 < 0x80) {
        f.exception = (Exception *)0x0;
      }
      else {
        f.exception = *(Exception **)((long)(replacement->_reader).data + 8);
      }
      if (uVar5 < 0x80) {
        pEVar6 = (Exception *)0x0;
      }
      else {
        pEVar6 = *(Exception **)(psVar3 + 4);
      }
      if (f.exception == pEVar6) {
        return;
      }
      this_00 = &f_1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[23]>
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,1000,FAILED,"replacement.getEnum().getTypeId() == type.getEnum().getTypeId()",
                 "_kjCondition,\"type changed enum type\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                 (char (*) [23])"type changed enum type");
      break;
    case 0x10:
      if (uVar2 < 0x80) {
        f.exception = (Exception *)0x0;
      }
      else {
        f.exception = *(Exception **)((long)(replacement->_reader).data + 8);
      }
      if (uVar5 < 0x80) {
        pEVar6 = (Exception *)0x0;
      }
      else {
        pEVar6 = *(Exception **)(psVar3 + 4);
      }
      if (f.exception == pEVar6) {
        return;
      }
      this_00 = &f_1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[41]>
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x3f4,FAILED,"replacement.getStruct().getTypeId() == type.getStruct().getTypeId()"
                 ,"_kjCondition,\"type changed to incompatible struct type\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                 (char (*) [41])"type changed to incompatible struct type");
      break;
    case 0x11:
      if (uVar2 < 0x80) {
        f.exception = (Exception *)0x0;
      }
      else {
        f.exception = *(Exception **)((long)(replacement->_reader).data + 8);
      }
      if (uVar5 < 0x80) {
        pEVar6 = (Exception *)0x0;
      }
      else {
        pEVar6 = *(Exception **)(psVar3 + 4);
      }
      if (f.exception == pEVar6) {
        return;
      }
      this_00 = &f_1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[44]>
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x3f9,FAILED,
                 "replacement.getInterface().getTypeId() == type.getInterface().getTypeId()",
                 "_kjCondition,\"type changed to incompatible interface type\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                 (char (*) [44])"type changed to incompatible interface type");
      break;
    default:
      goto switchD_0016d17e_default;
    }
  }
  this->compatibility = INCOMPATIBLE;
  kj::_::Debug::Fault::~Fault(this_00);
switchD_0016d17e_default:
  return;
}

Assistant:

void checkCompatibility(const schema::Type::Reader& type,
                          const schema::Type::Reader& replacement,
                          UpgradeToStructMode upgradeToStructMode) {
    if (replacement.which() != type.which()) {
      // Check for allowed "upgrade" to Data or AnyPointer.
      if (replacement.isData() && canUpgradeToData(type)) {
        replacementIsNewer();
        return;
      } else if (type.isData() && canUpgradeToData(replacement)) {
        replacementIsOlder();
        return;
      } else if (replacement.isAnyPointer() && canUpgradeToAnyPointer(type)) {
        replacementIsNewer();
        return;
      } else if (type.isAnyPointer() && canUpgradeToAnyPointer(replacement)) {
        replacementIsOlder();
        return;
      }

      if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
        if (type.isStruct()) {
          checkUpgradeToStruct(replacement, type.getStruct().getTypeId());
          return;
        } else if (replacement.isStruct()) {
          checkUpgradeToStruct(type, replacement.getStruct().getTypeId());
          return;
        }
      }

      FAIL_VALIDATE_SCHEMA("a type was changed");
    }

    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::ANY_POINTER:
        return;

      case schema::Type::LIST:
        checkCompatibility(type.getList().getElementType(), replacement.getList().getElementType(),
                           ALLOW_UPGRADE_TO_STRUCT);
        return;

      case schema::Type::ENUM:
        VALIDATE_SCHEMA(replacement.getEnum().getTypeId() == type.getEnum().getTypeId(),
                        "type changed enum type");
        return;

      case schema::Type::STRUCT:
        // TODO(someday):  If the IDs don't match, we should compare the two structs for
        //   compatibility.  This is tricky, though, because the new type's target may not yet be
        //   loaded.  In that case we could take the old type, make a copy of it, assign the new
        //   ID to the copy, and load() that.  That forces any struct type loaded for that ID to
        //   be compatible.  However, that has another problem, which is that it could be that the
        //   whole reason the type was replaced was to fork that type, and so an incompatibility
        //   could be very much expected.  This could be a rat hole...
        VALIDATE_SCHEMA(replacement.getStruct().getTypeId() == type.getStruct().getTypeId(),
                        "type changed to incompatible struct type");
        return;

      case schema::Type::INTERFACE:
        VALIDATE_SCHEMA(replacement.getInterface().getTypeId() == type.getInterface().getTypeId(),
                        "type changed to incompatible interface type");
        return;
    }

    // We assume unknown types (from newer versions of Cap'n Proto?) are equivalent.
  }